

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getStartOffsetFromCompact(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  byte *pbVar2;
  ValueLength VVar3;
  byte bVar4;
  ulong uVar5;
  
  pbVar2 = *(byte **)this;
  uVar5 = 0;
  bVar4 = 0;
  do {
    pbVar2 = pbVar2 + 1;
    uVar5 = uVar5 + ((ulong)(*pbVar2 & 0x7f) << (bVar4 & 0x3f));
    bVar4 = bVar4 + 7;
  } while ((char)*pbVar2 < '\0');
  VVar3 = 2;
  if (0x7f < uVar5) {
    do {
      VVar3 = VVar3 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar5 >> 7;
    } while (bVar1);
  }
  return VVar3;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }